

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O0

void aec_get_rsi_lsb_32(aec_stream *strm)

{
  int iVar1;
  long *in_RDI;
  int rsi;
  
  iVar1 = (int)in_RDI[7] * *(int *)((long)in_RDI + 0x34);
  memcpy(*(void **)(in_RDI[8] + 0x38),(void *)*in_RDI,(long)(iVar1 * 4));
  *in_RDI = *in_RDI + (long)(iVar1 * 4);
  in_RDI[1] = in_RDI[1] - (long)(iVar1 * 4);
  return;
}

Assistant:

void aec_get_rsi_lsb_32(struct aec_stream *strm)
{
    uint32_t *restrict out = strm->state->data_raw;
    const unsigned char *restrict in = strm->next_in;
    int rsi = strm->rsi * strm->block_size;

    for (int i = 0; i < rsi; i++)
        out[i] = (uint32_t)in[4 * i]
            | ((uint32_t)in[4 * i + 1] << 8)
            | ((uint32_t)in[4 * i + 2] << 16)
            | ((uint32_t)in[4 * i + 3] << 24);

    strm->next_in += 4 * rsi;
    strm->avail_in -= 4 * rsi;
}